

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O3

void If_ManImproveNodeFaninUpdate(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited)

{
  size_t __size;
  uint uVar1;
  If_Obj_t *pIVar2;
  long lVar3;
  void **ppvVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  if (((undefined1  [112])*pObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifReduce.c"
                  ,0x13c,
                  "void If_ManImproveNodeFaninUpdate(If_Man_t *, If_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  uVar1 = vFront->nSize;
  lVar6 = (ulong)uVar1 + 1;
  do {
    if ((int)lVar6 + -1 < 1) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
    }
    lVar5 = lVar6 + -1;
    lVar3 = lVar6 + -2;
    lVar6 = lVar5;
  } while ((If_Obj_t *)vFront->pArray[lVar3] != pObj);
  for (; (int)lVar5 < (int)uVar1; lVar5 = lVar5 + 1) {
    vFront->pArray[lVar5 + -1] = vFront->pArray[lVar5];
  }
  iVar7 = uVar1 - 1;
  vFront->nSize = iVar7;
  pIVar2 = pObj->pFanin0;
  if ((pIVar2->field_0x1 & 1) == 0) {
    if (iVar7 == vFront->nCap) {
      if ((int)uVar1 < 0x11) {
        if (vFront->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(vFront->pArray,0x80);
        }
        vFront->pArray = ppvVar4;
        vFront->nCap = 0x10;
      }
      else {
        __size = (ulong)(uint)(iVar7 * 2) * 8;
        if (vFront->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(__size);
        }
        else {
          ppvVar4 = (void **)realloc(vFront->pArray,__size);
        }
        vFront->pArray = ppvVar4;
        vFront->nCap = iVar7 * 2;
      }
    }
    else {
      ppvVar4 = vFront->pArray;
    }
    iVar7 = vFront->nSize;
    vFront->nSize = iVar7 + 1;
    ppvVar4[iVar7] = pIVar2;
    uVar1 = vVisited->nSize;
    if (uVar1 == vVisited->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar4;
        vVisited->nCap = 0x10;
      }
      else {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
        }
        vVisited->pArray = ppvVar4;
        vVisited->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar4 = vVisited->pArray;
    }
    iVar7 = vVisited->nSize;
    vVisited->nSize = iVar7 + 1;
    ppvVar4[iVar7] = pIVar2;
    pIVar2->field_0x1 = pIVar2->field_0x1 | 1;
  }
  pIVar2 = pObj->pFanin1;
  if ((pIVar2->field_0x1 & 1) == 0) {
    uVar1 = vFront->nSize;
    if (uVar1 == vFront->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vFront->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(vFront->pArray,0x80);
        }
        vFront->pArray = ppvVar4;
        vFront->nCap = 0x10;
      }
      else {
        if (vFront->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(vFront->pArray,(ulong)uVar1 << 4);
        }
        vFront->pArray = ppvVar4;
        vFront->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar4 = vFront->pArray;
    }
    iVar7 = vFront->nSize;
    vFront->nSize = iVar7 + 1;
    ppvVar4[iVar7] = pIVar2;
    uVar1 = vVisited->nSize;
    if (uVar1 == vVisited->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar4;
        vVisited->nCap = 0x10;
      }
      else {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
        }
        vVisited->pArray = ppvVar4;
        vVisited->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar4 = vVisited->pArray;
    }
    iVar7 = vVisited->nSize;
    vVisited->nSize = iVar7 + 1;
    ppvVar4[iVar7] = pIVar2;
    pIVar2->field_0x1 = pIVar2->field_0x1 | 1;
  }
  return;
}

Assistant:

void If_ManImproveNodeFaninUpdate( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited )
{
    If_Obj_t * pFanin;
    assert( If_ObjIsAnd(pObj) );
    Vec_PtrRemove( vFront, pObj );
    pFanin = If_ObjFanin0(pObj);
    if ( !pFanin->fMark )
    {
        Vec_PtrPush( vFront, pFanin );
        Vec_PtrPush( vVisited, pFanin );
        pFanin->fMark = 1;
    }
    pFanin = If_ObjFanin1(pObj);
    if ( !pFanin->fMark )
    {
        Vec_PtrPush( vFront, pFanin );
        Vec_PtrPush( vVisited, pFanin );
        pFanin->fMark = 1;
    }
}